

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O3

QMetaEnumBuilder __thiscall
QMetaObjectBuilder::addEnumerator(QMetaObjectBuilder *this,QMetaEnum *prototype)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  QMetaEnumBuilderPrivate *pQVar4;
  QMetaType metaType;
  _Storage<unsigned_long_long,_true> value;
  int index;
  long in_FS_OFFSET;
  QMetaEnumBuilder QVar5;
  optional<unsigned_long_long> oVar6;
  QByteArray local_60;
  QMetaEnumBuilder local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._mobj = (QMetaObjectBuilder *)&DAT_aaaaaaaaaaaaaaaa;
  local_48._index = -0x55555556;
  local_48._12_4_ = 0xaaaaaaaa;
  pcVar3 = QMetaEnum::name(prototype);
  QByteArray::QByteArray(&local_60,pcVar3,-1);
  QVar5 = addEnumerator(this,&local_60);
  local_48._mobj = QVar5._mobj;
  local_48._index = QVar5._index;
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
    }
  }
  pcVar3 = QMetaEnum::enumName(prototype);
  QByteArray::QByteArray(&local_60,pcVar3,-1);
  pQVar4 = QMetaEnumBuilder::d_func(&local_48);
  if (pQVar4 != (QMetaEnumBuilderPrivate *)0x0) {
    QByteArray::operator=(&pQVar4->enumName,&local_60);
  }
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
    }
  }
  metaType = QMetaEnum::metaType(prototype);
  QMetaEnumBuilder::setMetaType(&local_48,metaType);
  bVar1 = QMetaEnum::isFlag(prototype);
  pQVar4 = QMetaEnumBuilder::d_func(&local_48);
  if (pQVar4 != (QMetaEnumBuilderPrivate *)0x0) {
    (pQVar4->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
    super_QFlagsStorage<QtMocConstants::EnumFlags>.i =
         (uint)bVar1 |
         (pQVar4->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
         super_QFlagsStorage<QtMocConstants::EnumFlags>.i & 0xfffffffe;
  }
  bVar1 = QMetaEnum::isScoped(prototype);
  pQVar4 = QMetaEnumBuilder::d_func(&local_48);
  if (pQVar4 != (QMetaEnumBuilderPrivate *)0x0) {
    (pQVar4->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
    super_QFlagsStorage<QtMocConstants::EnumFlags>.i =
         ((pQVar4->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
          super_QFlagsStorage<QtMocConstants::EnumFlags>.i & 0xfffffffd) + (uint)bVar1 * 2;
  }
  iVar2 = QMetaEnum::keyCount(prototype);
  if (0 < iVar2) {
    index = 0;
    do {
      pcVar3 = QMetaEnum::key(prototype,index);
      QByteArray::QByteArray(&local_60,pcVar3,-1);
      oVar6 = QMetaEnum::value64(prototype,index);
      value._M_value =
           oVar6.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long_long>._M_payload;
      if (((undefined1  [16])
           oVar6.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long_long> & (undefined1  [16])0x1) ==
          (undefined1  [16])0x0) {
        value._M_value = 0;
      }
      QMetaEnumBuilder::addKey(&local_48,&local_60,value._M_value);
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
        }
      }
      index = index + 1;
    } while (iVar2 != index);
  }
  bVar1 = QMetaEnum::is64Bit(prototype);
  pQVar4 = QMetaEnumBuilder::d_func(&local_48);
  if (pQVar4 != (QMetaEnumBuilderPrivate *)0x0) {
    (pQVar4->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
    super_QFlagsStorage<QtMocConstants::EnumFlags>.i =
         (uint)bVar1 << 6 |
         (pQVar4->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
         super_QFlagsStorage<QtMocConstants::EnumFlags>.i & 0xffffffbf;
  }
  QVar5._index = local_48._index;
  QVar5._mobj = local_48._mobj;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    QVar5._12_4_ = 0;
    return QVar5;
  }
  __stack_chk_fail();
}

Assistant:

QMetaEnumBuilder QMetaObjectBuilder::addEnumerator(const QMetaEnum &prototype)
{
    QMetaEnumBuilder en = addEnumerator(prototype.name());
    en.setEnumName(prototype.enumName());
    en.setMetaType(prototype.metaType());
    en.setIsFlag(prototype.isFlag());
    en.setIsScoped(prototype.isScoped());
    int count = prototype.keyCount();
    for (int index = 0; index < count; ++index)
        en.addKey(prototype.key(index), prototype.value64(index).value_or(0));
    // reset the is64Bit() flag if necessary
    en.setIs64Bit(prototype.is64Bit());
    return en;
}